

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::Value::Value(Value *this,bool v)

{
  Type local_48;
  PackedData local_30;
  
  local_48.category = primitive;
  local_48.arrayElementCategory = invalid;
  local_48.isRef = false;
  local_48.isConstant = false;
  local_48.primitiveType.type = bool_;
  local_48.boundingSize = 0;
  local_48.arrayElementBoundingSize = 0;
  local_48.structure.object = (Structure *)0x0;
  Value(this,&local_48);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  getData(&local_30,this);
  PackedData::setAs<unsigned_char>(&local_30,v);
  return;
}

Assistant:

Value::Value (bool     v)  : Value (Type (PrimitiveType::bool_))     { getData().setAs (v ? (uint8_t) 1 : (uint8_t) 0); }